

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall
SQLite::Database::createFunction
          (Database *this,char *apFuncName,int aNbArg,bool abDeterministic,void *apApp,
          _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *apFunc,
          _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *apStep,
          _func_void_sqlite3_context_ptr *apFinal,_func_void_void_ptr *apDestroy)

{
  int aRet;
  int local_34;
  int ret;
  int TextRep;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *apFunc_local;
  void *apApp_local;
  bool abDeterministic_local;
  int aNbArg_local;
  char *apFuncName_local;
  Database *this_local;
  
  local_34 = 1;
  if (abDeterministic) {
    local_34 = 0x801;
  }
  aRet = sqlite3_create_function_v2
                   (this->mpSQLite,apFuncName,aNbArg,local_34,apApp,apFunc,apStep,apFinal,apDestroy)
  ;
  check(this,aRet);
  return;
}

Assistant:

void Database::createFunction(const char*   apFuncName,
                              int           aNbArg,
                              bool          abDeterministic,
                              void*         apApp,
                              void        (*apFunc)(sqlite3_context *, int, sqlite3_value **),
                              void        (*apStep)(sqlite3_context *, int, sqlite3_value **),
                              void        (*apFinal)(sqlite3_context *),   // NOLINT(readability/casting)
                              void        (*apDestroy)(void *))
{
    int TextRep = SQLITE_UTF8;
    // optimization if deterministic function (e.g. of nondeterministic function random())
    if (abDeterministic) {
        TextRep = TextRep|SQLITE_DETERMINISTIC;
    }
    const int ret = sqlite3_create_function_v2(mpSQLite, apFuncName, aNbArg, TextRep,
                                               apApp, apFunc, apStep, apFinal, apDestroy);
    check(ret);
}